

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O0

void __thiscall VariableNode::~VariableNode(VariableNode *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__VariableNode_001ae7b0;
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  ExpressionNode::~ExpressionNode((ExpressionNode *)0x1789c4);
  return;
}

Assistant:

VariableNode(const std::string& name): name_(name) {}